

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<std::vector<char,std::allocator<char>>const&>,testing::Matcher<unsigned_long>>,std::tuple<std::vector<char,std::allocator<char>>const&,unsigned_long>>
               (tuple<testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
                *matcher_tuple,
               tuple<const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long> *value_tuple)

{
  bool bVar1;
  DummyMatchResultListener dummy;
  MatchResultListener local_28;
  
  local_28.stream_ = (ostream *)0x0;
  local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_0023baf8;
  bVar1 = MatcherBase<const_std::vector<char,_std::allocator<char>_>_&>::MatchAndExplain
                    ((MatcherBase<const_std::vector<char,_std::allocator<char>_>_&> *)
                     &(matcher_tuple->
                      super__Tuple_impl<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
                      ).
                      super__Head_base<0UL,_testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_false>
                     ,(value_tuple->
                      super__Tuple_impl<0UL,_const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long>
                      ).
                      super__Head_base<0UL,_const_std::vector<char,_std::allocator<char>_>_&,_false>
                      ._M_head_impl,&local_28);
  if (bVar1) {
    local_28.stream_ = (ostream *)0x0;
    local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_0023baf8;
    bVar1 = MatcherBase<unsigned_long>::MatchAndExplain
                      ((MatcherBase<unsigned_long> *)matcher_tuple,(unsigned_long *)value_tuple,
                       &local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }